

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O0

string * handle_server_list_long_page_abi_cxx11_(string_view param_1)

{
  Server *pSVar1;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  Server *pSVar5;
  const_reference ppSVar6;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  string local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  string local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  string *server_list_long_json;
  Server *server;
  size_t index;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_20;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *servers;
  string_view param_0_local;
  
  param_0_local._M_len = (size_t)param_1._M_str;
  servers = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)param_1._M_len;
  RenX::getCore();
  RenX::Core::getServers();
  server = (Server *)0x0;
  local_20 = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&index;
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)pbVar3);
  local_50 = pbVar3;
  sVar4 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::size(local_20);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (pbVar3,sVar4 << 8);
  local_70[0] = sv("[",1);
  std::__cxx11::string::operator=((string *)local_50,local_70);
  do {
    pSVar1 = server;
    pSVar5 = (Server *)std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::size(local_20);
    if (pSVar1 == pSVar5) {
LAB_001227b4:
      for (; pSVar1 = server,
          pSVar5 = (Server *)
                   std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::size(local_20),
          pSVar1 != pSVar5; server = server + 1) {
        ppSVar6 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::operator[]
                            (local_20,(size_type)server);
        server_list_long_json = (string *)*ppSVar6;
        bVar2 = RenX::Server::isConnected();
        if (((bVar2 & 1) != 0) && (bVar2 = RenX::Server::isFullyConnected(), (bVar2 & 1) != 0)) {
          local_b0 = sv(",\n\t",3);
          std::__cxx11::string::operator+=((string *)local_50,&local_b0);
          RenX_ServerListPlugin::server_as_long_json_abi_cxx11_
                    (&local_d0,&pluginInstance,(Server *)server_list_long_json);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(local_50,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
        }
      }
      local_e0 = sv("\n]",2);
      std::__cxx11::string::operator+=((string *)local_50,&local_e0);
      pbVar3 = local_50;
      std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector
                ((vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&index);
      return pbVar3;
    }
    ppSVar6 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::operator[]
                        (local_20,(size_type)server);
    server_list_long_json = (string *)*ppSVar6;
    bVar2 = RenX::Server::isConnected();
    if (((bVar2 & 1) != 0) && (bVar2 = RenX::Server::isFullyConnected(), (bVar2 & 1) != 0)) {
      local_80 = sv("\n\t",2);
      std::__cxx11::string::operator+=((string *)local_50,&local_80);
      RenX_ServerListPlugin::server_as_long_json_abi_cxx11_
                (&local_a0,&pluginInstance,(Server *)server_list_long_json);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (local_50,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      server = server + 1;
      goto LAB_001227b4;
    }
    server = server + 1;
  } while( true );
}

Assistant:

std::string* handle_server_list_long_page(std::string_view) {
	const auto& servers = RenX::getCore()->getServers();
	size_t index = 0;
	RenX::Server *server;
	std::string *server_list_long_json = new std::string;
	server_list_long_json->reserve(256 * servers.size());

	// regenerate server_list_json

	*server_list_long_json = "["sv;

	while (index != servers.size()) {
		server = servers[index];
		if (server->isConnected() && server->isFullyConnected()) {
			*server_list_long_json += "\n\t"sv;
			*server_list_long_json += pluginInstance.server_as_long_json(*server);
			++index;
			break;
		}
		++index;
	}
	while (index != servers.size()) {
		server = servers[index];
		if (server->isConnected() && server->isFullyConnected()) {
			*server_list_long_json += ",\n\t"sv;
			*server_list_long_json += pluginInstance.server_as_long_json(*server);
		}
		++index;
	}

	*server_list_long_json += "\n]"sv;

	return server_list_long_json;
}